

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

stbtt__buf stbtt__cid_get_glyph_subrs(stbtt_fontinfo *info,int glyph_index)

{
  stbtt__buf cff;
  uint uVar1;
  stbtt_uint8 sVar2;
  byte bVar3;
  stbtt_uint32 sVar4;
  stbtt_uint32 sVar5;
  int in_ESI;
  long in_RDI;
  stbtt__buf sVar6;
  int i;
  int fdselector;
  int fmt;
  int v;
  int end;
  int start;
  int nranges;
  stbtt__buf fdselect;
  undefined8 in_stack_ffffffffffffff68;
  int n;
  stbtt__buf *in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff78 [16];
  int i_00;
  uchar *in_stack_ffffffffffffff98;
  uchar *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  uint local_48;
  stbtt_uint32 local_38;
  stbtt__buf local_30;
  int local_1c;
  long local_18;
  
  local_30.data = *(uchar **)(in_RDI + 0x90);
  local_30._8_8_ = *(undefined8 *)(in_RDI + 0x98);
  local_48 = 0xffffffff;
  local_1c = in_ESI;
  local_18 = in_RDI;
  stbtt__buf_seek(&local_30,0);
  sVar2 = stbtt__buf_get8(&local_30);
  i_00 = in_stack_ffffffffffffff78._12_4_;
  n = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if (sVar2 == '\0') {
    stbtt__buf_skip(in_stack_ffffffffffffff70,n);
    bVar3 = stbtt__buf_get8(&local_30);
    uVar1 = (uint)bVar3;
  }
  else {
    uVar1 = local_48;
    if (sVar2 == '\x03') {
      sVar4 = stbtt__buf_get(in_stack_ffffffffffffff70,n);
      local_38 = stbtt__buf_get(in_stack_ffffffffffffff70,n);
      for (in_stack_ffffffffffffffb4 = 0; i_00 = in_stack_ffffffffffffff78._12_4_, uVar1 = local_48,
          in_stack_ffffffffffffffb4 < (int)sVar4;
          in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1) {
        bVar3 = stbtt__buf_get8(&local_30);
        sVar5 = stbtt__buf_get(in_stack_ffffffffffffff70,n);
        i_00 = in_stack_ffffffffffffff78._12_4_;
        if (((int)local_38 <= local_1c) && (uVar1 = (uint)bVar3, local_1c < (int)sVar5)) break;
        local_38 = sVar5;
      }
    }
  }
  local_48 = uVar1;
  if (local_48 == 0xffffffff) {
    sVar6 = stbtt__new_buf((void *)0x0,0);
    in_stack_ffffffffffffffa0 = sVar6.data;
    in_stack_ffffffffffffffa8 = sVar6._8_8_;
  }
  stbtt__cff_index_get(*(stbtt__buf *)(local_18 + 0x40),i_00);
  cff.cursor = in_stack_ffffffffffffffb0;
  cff.data = (uchar *)in_stack_ffffffffffffffa8;
  cff.size = in_stack_ffffffffffffffb4;
  sVar6._8_8_ = in_stack_ffffffffffffffa0;
  sVar6.data = in_stack_ffffffffffffff98;
  sVar6 = stbtt__get_subrs(cff,sVar6);
  return sVar6;
}

Assistant:

static stbtt__buf stbtt__cid_get_glyph_subrs(const stbtt_fontinfo *info, int glyph_index)
{
   stbtt__buf fdselect = info->fdselect;
   int nranges, start, end, v, fmt, fdselector = -1, i;

   stbtt__buf_seek(&fdselect, 0);
   fmt = stbtt__buf_get8(&fdselect);
   if (fmt == 0) {
      // untested
      stbtt__buf_skip(&fdselect, glyph_index);
      fdselector = stbtt__buf_get8(&fdselect);
   } else if (fmt == 3) {
      nranges = stbtt__buf_get16(&fdselect);
      start = stbtt__buf_get16(&fdselect);
      for (i = 0; i < nranges; i++) {
         v = stbtt__buf_get8(&fdselect);
         end = stbtt__buf_get16(&fdselect);
         if (glyph_index >= start && glyph_index < end) {
            fdselector = v;
            break;
         }
         start = end;
      }
   }
   if (fdselector == -1) stbtt__new_buf(NULL, 0);
   return stbtt__get_subrs(info->cff, stbtt__cff_index_get(info->fontdicts, fdselector));
}